

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O0

void dumpSetup(Setup *s)

{
  char *pcVar1;
  int local_18;
  int local_14;
  int i_1;
  int i;
  Setup *s_local;
  
  printf("PC: %04x  Opcode: %04x  ",(ulong)s->pc,(ulong)s->opcode);
  printf("Ext1: %04x  Ext2: %04x  Ext3: %04x ",(ulong)s->ext1,(ulong)s->ext2,(ulong)s->ext3);
  pcVar1 = "";
  if ((s->supervisor & 1U) != 0) {
    pcVar1 = "(SUPERVISOR MODE)";
  }
  printf("%s\n",pcVar1);
  printf("         ");
  printf("CCR: %02x  ",(ulong)s->ccr);
  printf("VBR: %02x  ",(ulong)s->vbr);
  printf("SFC: %02x  ",(ulong)s->sfc);
  printf("DFC: %02x  ",(ulong)s->dfc);
  printf("CACR: %02x ",(ulong)s->cacr);
  printf("CAAR: %02x\n",(ulong)s->caar);
  printf("         ");
  printf("Dn: ");
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    printf("%8x ",(ulong)s->d[local_14]);
  }
  printf("\n");
  printf("         ");
  printf("An: ");
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    printf("%8x ",(ulong)s->a[local_18]);
  }
  printf("\n\n");
  return;
}

Assistant:

void dumpSetup(Setup &s)
{
    printf("PC: %04x  Opcode: %04x  ", s.pc, s.opcode);
    printf("Ext1: %04x  Ext2: %04x  Ext3: %04x ", s.ext1, s.ext2, s.ext3);
    printf("%s\n", s.supervisor ? "(SUPERVISOR MODE)" : "");
    printf("         ");
    printf("CCR: %02x  ", s.ccr);
    printf("VBR: %02x  ", s.vbr);
    printf("SFC: %02x  ", s.sfc);
    printf("DFC: %02x  ", s.dfc);
    printf("CACR: %02x ", s.cacr);
    printf("CAAR: %02x\n", s.caar);
    printf("         ");
    printf("Dn: ");
    for (int i = 0; i < 8; i++) printf("%8x ", s.d[i]);
    printf("\n");
    printf("         ");
    printf("An: ");
    for (int i = 0; i < 8; i++) printf("%8x ", s.a[i]);
    printf("\n\n");
}